

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O2

void __thiscall fasttext::Vector::addRow(Vector *this,Matrix *A,int64_t i,real a)

{
  pointer pfVar1;
  pointer pfVar2;
  undefined1 auVar3 [16];
  uint __line;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  char *__assertion;
  undefined1 in_register_00001204 [12];
  
  if (i < 0) {
    __assertion = "i >= 0";
    __line = 0x49;
  }
  else if (i < A->m_) {
    pfVar1 = (this->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar4 = (long)(this->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pfVar1;
    uVar5 = lVar4 >> 2;
    if (uVar5 == A->n_) {
      pfVar2 = (A->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (uVar6 = 0; (~(lVar4 >> 0x3f) & uVar5) != uVar6; uVar6 = uVar6 + 1) {
        auVar3._4_12_ = in_register_00001204;
        auVar3._0_4_ = a;
        auVar3 = vfmadd213ss_fma(ZEXT416((uint)pfVar2[i * uVar5 + uVar6]),auVar3,
                                 ZEXT416((uint)pfVar1[uVar6]));
        pfVar1[uVar6] = auVar3._0_4_;
      }
      return;
    }
    __assertion = "size() == A.size(1)";
    __line = 0x4b;
  }
  else {
    __assertion = "i < A.size(0)";
    __line = 0x4a;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Whadup[P]weightedFastText/src/vector.cc"
                ,__line,"void fasttext::Vector::addRow(const Matrix &, int64_t, real)");
}

Assistant:

void Vector::addRow(const Matrix& A, int64_t i, real a) {
  assert(i >= 0);
  assert(i < A.size(0));
  assert(size() == A.size(1));
  for (int64_t j = 0; j < A.size(1); j++) {
    data_[j] += a * A.at(i, j);
  }
}